

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::pack_B_tile_quantize(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  long lVar15;
  int kk;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [64];
  undefined1 (*pauVar22) [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  __m128i _vindex;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_ZMM10 [64];
  size_t *psVar7;
  
  iVar5 = cpu_support_x86_avx512_vnni();
  if (iVar5 != 0) {
    pack_B_tile_fp32_to_int8_avx512vnni(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar5 = cpu_support_x86_avx_vnni_int8();
  if (iVar5 == 0) {
    iVar5 = cpu_support_x86_avx_vnni();
    auVar28 = _DAT_00543ec0;
    auVar25 = _DAT_00543eb0;
    if (iVar5 == 0) {
      iVar5 = B->elempack;
      psVar7 = (size_t *)&B->w;
      if (B->dims == 3) {
        psVar7 = &B->cstep;
      }
      iVar17 = (int)*psVar7;
      lVar6 = (long)iVar17;
      pauVar13 = (undefined1 (*) [16])BT->data;
      lVar8 = (long)(iVar5 * k);
      auVar23._4_4_ = in_XMM0_Db;
      auVar23._0_4_ = scale;
      auVar23._8_4_ = in_XMM0_Dc;
      auVar23._12_4_ = in_XMM0_Dd;
      auVar31 = vbroadcastss_avx512f(auVar23);
      lVar18 = (long)(iVar17 * 8);
      lVar9 = (long)(iVar17 * 4);
      auVar32 = vpbroadcastd_avx512f();
      vpmulld_avx512f(auVar32,_DAT_005440c0);
      lVar14 = (long)j;
      lVar10 = (long)max_jj;
      lVar19 = (long)k;
      lVar11 = lVar19 * 4 + lVar6 * lVar14 * 4;
      lVar15 = (lVar14 * 4 + 4) * lVar6 + lVar19 * 4;
      uVar12 = 0;
      auVar32 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar33 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
      auVar26[8] = 0x81;
      auVar26._0_8_ = 0x8181818181818181;
      auVar26[9] = 0x81;
      auVar26[10] = 0x81;
      auVar26[0xb] = 0x81;
      auVar26[0xc] = 0x81;
      auVar26[0xd] = 0x81;
      auVar26[0xe] = 0x81;
      auVar26[0xf] = 0x81;
      for (; auVar24 = _DAT_00543ec0, auVar23 = _DAT_00543eb0, (long)(uVar12 | 0xf) < lVar10;
          uVar12 = uVar12 + 0x10) {
        pauVar21 = (undefined1 (*) [64])((long)B->data + lVar8 * 4 + (lVar14 + uVar12) * lVar6 * 4);
        if (iVar5 == 0x10) {
          for (iVar16 = 0; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
            auVar34 = vmulps_avx512f(auVar31,*pauVar21);
            auVar35 = vmulps_avx512f(auVar31,pauVar21[1]);
            auVar36 = vmovdqa64_avx512f(auVar33);
            auVar36 = vpternlogd_avx512f(auVar36,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar36);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            auVar34 = vmovdqa64_avx512f(auVar33);
            auVar34 = vpternlogd_avx512f(auVar34,auVar35,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar35,auVar34);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar24 = vpmovsdb_avx512f(auVar34);
            auVar24 = vpmaxsb_avx(auVar24,auVar26);
            auVar27 = vpunpcklbw_avx(auVar23,auVar24);
            in_ZMM9 = ZEXT1664(auVar27);
            auVar23 = vpunpckhbw_avx(auVar23,auVar24);
            *pauVar13 = auVar27;
            pauVar13[1] = auVar23;
            pauVar13 = pauVar13 + 2;
            pauVar21 = pauVar21 + 2;
          }
          for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
            auVar34 = vmulps_avx512f(auVar31,*pauVar21);
            auVar35 = vmovdqa64_avx512f(auVar33);
            auVar35 = vpternlogd_avx512f(auVar35,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar35);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            *pauVar13 = auVar23;
            pauVar13 = pauVar13 + 1;
            pauVar21 = pauVar21 + 1;
          }
        }
        if (iVar5 == 8) {
          for (iVar16 = 0; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
            auVar34 = vmulps_avx512f(auVar31,*pauVar21);
            auVar35 = vmulps_avx512f(auVar31,*(undefined1 (*) [64])(*pauVar21 + lVar18 * 4));
            auVar36 = vmovdqa64_avx512f(auVar33);
            auVar36 = vpternlogd_avx512f(auVar36,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar36);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar34 = vmovdqa64_avx512f(auVar33);
            in_ZMM9 = vpternlogd_avx512f(auVar34,auVar35,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar35,in_ZMM9);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar24 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpshufb_avx(auVar23,auVar25);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            auVar24 = vpshufb_avx(auVar24,auVar25);
            auVar24 = vpmaxsb_avx(auVar24,auVar26);
            *pauVar13 = auVar23;
            pauVar13[1] = auVar24;
            pauVar13 = pauVar13 + 2;
            pauVar21 = pauVar21 + 1;
          }
          for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
            auVar34 = vinsertf64x4_avx512f
                                (ZEXT3264(*(undefined1 (*) [32])*pauVar21),
                                 *(undefined1 (*) [32])(*pauVar21 + lVar18 * 4),1);
            auVar34 = vmulps_avx512f(auVar34,auVar31);
            auVar35 = vmovdqa64_avx512f(auVar33);
            auVar35 = vpternlogd_avx512f(auVar35,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar35);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            *pauVar13 = auVar23;
            pauVar13 = pauVar13 + 1;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
          }
        }
        if (iVar5 == 4) {
          for (iVar16 = 0; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
            auVar34 = vinsertf64x4_avx512f
                                (ZEXT3264(*(undefined1 (*) [32])*pauVar21),
                                 *(undefined1 (*) [32])(*pauVar21 + lVar9 * 4),1);
            auVar35 = vinsertf64x4_avx512f
                                (ZEXT3264(*(undefined1 (*) [32])(*pauVar21 + lVar18 * 4)),
                                 *(undefined1 (*) [32])(*pauVar21 + (long)(iVar17 * 0xc) * 4),1);
            auVar34 = vmulps_avx512f(auVar34,auVar31);
            auVar35 = vmulps_avx512f(auVar35,auVar31);
            auVar36 = vmovdqa64_avx512f(auVar33);
            auVar36 = vpternlogd_avx512f(auVar36,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar36);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar34 = vmovdqa64_avx512f(auVar33);
            in_ZMM9 = vpternlogd_avx512f(auVar34,auVar35,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar35,in_ZMM9);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar24 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpshufb_avx(auVar23,auVar28);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            auVar24 = vpshufb_avx(auVar24,auVar28);
            auVar24 = vpmaxsb_avx(auVar24,auVar26);
            *pauVar13 = auVar23;
            pauVar13[1] = auVar24;
            pauVar13 = pauVar13 + 2;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
          }
          for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
            auVar29._16_16_ = *(undefined1 (*) [16])(*pauVar21 + (long)(iVar17 * 0xc) * 4);
            auVar29._0_16_ = *(undefined1 (*) [16])(*pauVar21 + lVar18 * 4);
            auVar34 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])(*pauVar21 + lVar9 * 4),
                                                     *(undefined1 (*) [16])*pauVar21)),auVar29,1);
            auVar34 = vmulps_avx512f(auVar34,auVar31);
            auVar35 = vmovdqa64_avx512f(auVar33);
            auVar35 = vpternlogd_avx512f(auVar35,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar35);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            *pauVar13 = auVar23;
            pauVar13 = pauVar13 + 1;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
          }
        }
        if (iVar5 == 1) {
          for (iVar16 = 0; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
            auVar34 = vgatherdps_avx512f(*(undefined4 *)(*pauVar21 + (long)B * 4));
            auVar35 = vgatherdps_avx512f(*(undefined4 *)(*pauVar21 + (long)B * 4 + 4));
            auVar34 = vmulps_avx512f(auVar34,auVar31);
            auVar35 = vmulps_avx512f(auVar35,auVar31);
            auVar36 = vmovdqa64_avx512f(auVar33);
            auVar36 = vpternlogd_avx512f(auVar36,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar36);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            auVar34 = vmovdqa64_avx512f(auVar33);
            auVar34 = vpternlogd_avx512f(auVar34,auVar35,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar35,auVar34);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar24 = vpmovsdb_avx512f(auVar34);
            auVar24 = vpmaxsb_avx(auVar24,auVar26);
            auVar27 = vpunpcklbw_avx(auVar23,auVar24);
            in_ZMM9 = ZEXT1664(auVar27);
            auVar23 = vpunpckhbw_avx(auVar23,auVar24);
            *pauVar13 = auVar27;
            pauVar13[1] = auVar23;
            pauVar13 = pauVar13 + 2;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 8);
          }
          for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
            auVar34 = vgatherdps_avx512f(*(undefined4 *)(*pauVar21 + (long)B * 4));
            auVar34 = vmulps_avx512f(auVar34,auVar31);
            auVar35 = vmovdqa64_avx512f(auVar33);
            auVar35 = vpternlogd_avx512f(auVar35,auVar34,auVar32,0xf8);
            auVar34 = vaddps_avx512f(auVar34,auVar35);
            auVar34 = vcvttps2dq_avx512f(auVar34);
            auVar23 = vpmovsdb_avx512f(auVar34);
            auVar23 = vpmaxsb_avx(auVar23,auVar26);
            *pauVar13 = auVar23;
            pauVar13 = pauVar13 + 1;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 4);
          }
        }
        lVar11 = lVar11 + lVar6 * 0x40;
        lVar15 = lVar15 + lVar6 * 0x40;
      }
      auVar29 = vpbroadcastd_avx512vl();
      vpmulld_avx2(auVar29,_DAT_0053a5c0);
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar40._8_4_ = 0x3f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._12_4_ = 0x3f000000;
      auVar40._16_4_ = 0x3f000000;
      auVar40._20_4_ = 0x3f000000;
      auVar40._24_4_ = 0x3f000000;
      auVar40._28_4_ = 0x3f000000;
      auVar43._8_2_ = 0x7f;
      auVar43._0_8_ = 0x7f007f007f007f;
      auVar43._10_2_ = 0x7f;
      auVar43._12_2_ = 0x7f;
      auVar43._14_2_ = 0x7f;
      auVar43._16_2_ = 0x7f;
      auVar43._18_2_ = 0x7f;
      auVar43._20_2_ = 0x7f;
      auVar43._22_2_ = 0x7f;
      auVar43._24_2_ = 0x7f;
      auVar43._26_2_ = 0x7f;
      auVar43._28_2_ = 0x7f;
      auVar43._30_2_ = 0x7f;
      auVar55._8_2_ = 0xff81;
      auVar55._0_8_ = 0xff81ff81ff81ff81;
      auVar55._10_2_ = 0xff81;
      auVar55._12_2_ = 0xff81;
      auVar55._14_2_ = 0xff81;
      auVar55._16_2_ = 0xff81;
      auVar55._18_2_ = 0xff81;
      auVar55._20_2_ = 0xff81;
      auVar55._22_2_ = 0xff81;
      auVar55._24_2_ = 0xff81;
      auVar55._26_2_ = 0xff81;
      auVar55._28_2_ = 0xff81;
      auVar55._30_2_ = 0xff81;
      auVar31 = ZEXT3264(auVar55);
      for (; pvVar2 = B->data, (long)(uVar12 | 7) < lVar10; uVar12 = uVar12 + 8) {
        pfVar20 = (float *)((long)pvVar2 + lVar8 * 4 + (uVar12 + lVar14) * lVar6 * 4);
        if (iVar5 == 8) {
          for (iVar17 = 0; iVar17 + 1 < max_kk; iVar17 = iVar17 + 2) {
            auVar32._0_4_ = scale * *pfVar20;
            auVar32._4_4_ = scale * pfVar20[1];
            auVar32._8_4_ = scale * pfVar20[2];
            auVar32._12_4_ = scale * pfVar20[3];
            auVar32._16_4_ = scale * pfVar20[4];
            auVar32._20_4_ = scale * pfVar20[5];
            auVar32._28_36_ = in_ZMM9._28_36_;
            auVar32._24_4_ = scale * pfVar20[6];
            auVar33._0_4_ = scale * pfVar20[8];
            auVar33._4_4_ = scale * pfVar20[9];
            auVar33._8_4_ = scale * pfVar20[10];
            auVar33._12_4_ = scale * pfVar20[0xb];
            auVar33._16_4_ = scale * pfVar20[0xc];
            auVar33._20_4_ = scale * pfVar20[0xd];
            auVar33._28_36_ = in_ZMM10._28_36_;
            auVar33._24_4_ = scale * pfVar20[0xe];
            auVar29 = vpternlogd_avx512vl(auVar40,auVar32._0_32_,auVar38,0xf8);
            auVar30 = vpternlogd_avx512vl(auVar40,auVar33._0_32_,auVar38,0xf8);
            auVar78._0_4_ = (int)(auVar32._0_4_ + auVar29._0_4_);
            auVar78._4_4_ = (int)(auVar32._4_4_ + auVar29._4_4_);
            auVar78._8_4_ = (int)(auVar32._8_4_ + auVar29._8_4_);
            auVar78._12_4_ = (int)(auVar32._12_4_ + auVar29._12_4_);
            auVar78._16_4_ = (int)(auVar32._16_4_ + auVar29._16_4_);
            auVar78._20_4_ = (int)(auVar32._20_4_ + auVar29._20_4_);
            auVar78._24_4_ = (int)(auVar32._24_4_ + auVar29._24_4_);
            auVar78._28_4_ = (int)(in_ZMM9._28_4_ + auVar29._28_4_);
            auVar76._0_4_ = (int)(auVar33._0_4_ + auVar30._0_4_);
            auVar76._4_4_ = (int)(auVar33._4_4_ + auVar30._4_4_);
            auVar76._8_4_ = (int)(auVar33._8_4_ + auVar30._8_4_);
            auVar76._12_4_ = (int)(auVar33._12_4_ + auVar30._12_4_);
            auVar76._16_4_ = (int)(auVar33._16_4_ + auVar30._16_4_);
            auVar76._20_4_ = (int)(auVar33._20_4_ + auVar30._20_4_);
            auVar76._24_4_ = (int)(auVar33._24_4_ + auVar30._24_4_);
            auVar76._28_4_ = (int)(in_ZMM10._28_4_ + auVar30._28_4_);
            auVar29 = vpackssdw_avx2(auVar78,auVar76);
            auVar29 = vpermq_avx2(auVar29,0xd8);
            auVar29 = vpminsw_avx2(auVar29,auVar43);
            auVar29 = vpmaxsw_avx2(auVar29,auVar55);
            in_ZMM10 = ZEXT1664(auVar29._16_16_);
            auVar25 = vpacksswb_avx(auVar29._0_16_,auVar29._16_16_);
            auVar25 = vpshufb_avx(auVar25,auVar23);
            in_ZMM9 = ZEXT1664(auVar25);
            *pauVar13 = auVar25;
            pauVar13 = pauVar13 + 1;
            pfVar20 = pfVar20 + 0x10;
          }
          for (; iVar17 < max_kk; iVar17 = iVar17 + 1) {
            auVar34._0_4_ = scale * *pfVar20;
            auVar34._4_4_ = scale * pfVar20[1];
            auVar34._8_4_ = scale * pfVar20[2];
            auVar34._12_4_ = scale * pfVar20[3];
            auVar34._16_4_ = scale * pfVar20[4];
            auVar34._20_4_ = scale * pfVar20[5];
            auVar34._28_36_ = in_ZMM9._28_36_;
            auVar34._24_4_ = scale * pfVar20[6];
            auVar29 = vpternlogd_avx512vl(auVar40,auVar34._0_32_,auVar38,0xf8);
            in_ZMM10 = ZEXT3264(auVar29);
            auVar30._0_4_ = (int)(auVar34._0_4_ + auVar29._0_4_);
            auVar30._4_4_ = (int)(auVar34._4_4_ + auVar29._4_4_);
            auVar30._8_4_ = (int)(auVar34._8_4_ + auVar29._8_4_);
            auVar30._12_4_ = (int)(auVar34._12_4_ + auVar29._12_4_);
            auVar30._16_4_ = (int)(auVar34._16_4_ + auVar29._16_4_);
            auVar30._20_4_ = (int)(auVar34._20_4_ + auVar29._20_4_);
            auVar30._24_4_ = (int)(auVar34._24_4_ + auVar29._24_4_);
            auVar30._28_4_ = (int)(in_ZMM9._28_4_ + auVar29._28_4_);
            auVar25 = vpmovsdb_avx512vl(auVar30);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = auVar25._0_8_;
            auVar25 = vpmaxsb_avx(auVar28,auVar26);
            in_ZMM9 = ZEXT1664(auVar25);
            *(long *)*pauVar13 = auVar25._0_8_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
            pfVar20 = pfVar20 + 8;
          }
        }
        if (iVar5 == 4) {
          for (iVar17 = 0; iVar17 + 1 < max_kk; iVar17 = iVar17 + 2) {
            auVar35._0_4_ = scale * *pfVar20;
            auVar35._4_4_ = scale * pfVar20[1];
            auVar35._8_4_ = scale * pfVar20[2];
            auVar35._12_4_ = scale * pfVar20[3];
            auVar35._16_4_ = scale * pfVar20[4];
            auVar35._20_4_ = scale * pfVar20[5];
            auVar35._28_36_ = in_ZMM9._28_36_;
            auVar35._24_4_ = scale * pfVar20[6];
            pfVar1 = pfVar20 + lVar9;
            auVar36._0_4_ = scale * *pfVar1;
            auVar36._4_4_ = scale * pfVar1[1];
            auVar36._8_4_ = scale * pfVar1[2];
            auVar36._12_4_ = scale * pfVar1[3];
            auVar36._16_4_ = scale * pfVar1[4];
            auVar36._20_4_ = scale * pfVar1[5];
            auVar36._28_36_ = in_ZMM10._28_36_;
            auVar36._24_4_ = scale * pfVar1[6];
            auVar29 = vpternlogd_avx512vl(auVar40,auVar35._0_32_,auVar38,0xf8);
            auVar30 = vpternlogd_avx512vl(auVar40,auVar36._0_32_,auVar38,0xf8);
            auVar69._0_4_ = (int)(auVar35._0_4_ + auVar29._0_4_);
            auVar69._4_4_ = (int)(auVar35._4_4_ + auVar29._4_4_);
            auVar69._8_4_ = (int)(auVar35._8_4_ + auVar29._8_4_);
            auVar69._12_4_ = (int)(auVar35._12_4_ + auVar29._12_4_);
            auVar69._16_4_ = (int)(auVar35._16_4_ + auVar29._16_4_);
            auVar69._20_4_ = (int)(auVar35._20_4_ + auVar29._20_4_);
            auVar69._24_4_ = (int)(auVar35._24_4_ + auVar29._24_4_);
            auVar69._28_4_ = (int)(in_ZMM9._28_4_ + auVar29._28_4_);
            auVar77._0_4_ = (int)(auVar36._0_4_ + auVar30._0_4_);
            auVar77._4_4_ = (int)(auVar36._4_4_ + auVar30._4_4_);
            auVar77._8_4_ = (int)(auVar36._8_4_ + auVar30._8_4_);
            auVar77._12_4_ = (int)(auVar36._12_4_ + auVar30._12_4_);
            auVar77._16_4_ = (int)(auVar36._16_4_ + auVar30._16_4_);
            auVar77._20_4_ = (int)(auVar36._20_4_ + auVar30._20_4_);
            auVar77._24_4_ = (int)(auVar36._24_4_ + auVar30._24_4_);
            auVar77._28_4_ = (int)(in_ZMM10._28_4_ + auVar30._28_4_);
            auVar29 = vpackssdw_avx2(auVar69,auVar77);
            auVar29 = vpermq_avx2(auVar29,0xd8);
            auVar29 = vpminsw_avx2(auVar29,auVar43);
            auVar29 = vpmaxsw_avx2(auVar29,auVar55);
            in_ZMM10 = ZEXT1664(auVar29._16_16_);
            auVar25 = vpacksswb_avx(auVar29._0_16_,auVar29._16_16_);
            auVar25 = vpshufb_avx(auVar25,auVar24);
            in_ZMM9 = ZEXT1664(auVar25);
            *pauVar13 = auVar25;
            pauVar13 = pauVar13 + 1;
            pfVar20 = pfVar20 + 8;
          }
          for (; iVar17 < max_kk; iVar17 = iVar17 + 1) {
            auVar3._4_4_ = pfVar20[1] * scale;
            auVar3._0_4_ = *pfVar20 * scale;
            auVar3._8_4_ = pfVar20[2] * scale;
            auVar3._12_4_ = pfVar20[3] * scale;
            auVar3._16_4_ = pfVar20[lVar9 + 4] * scale;
            auVar3._20_4_ = pfVar20[lVar9 + 5] * scale;
            auVar3._24_4_ = pfVar20[lVar9 + 6] * scale;
            auVar3._28_4_ = pfVar20[lVar9 + 7];
            auVar29 = vpternlogd_avx512vl(auVar40,auVar3,auVar38,0xf8);
            in_ZMM10 = ZEXT3264(auVar29);
            auVar70._0_4_ = (int)(*pfVar20 * scale + auVar29._0_4_);
            auVar70._4_4_ = (int)(pfVar20[1] * scale + auVar29._4_4_);
            auVar70._8_4_ = (int)(pfVar20[2] * scale + auVar29._8_4_);
            auVar70._12_4_ = (int)(pfVar20[3] * scale + auVar29._12_4_);
            auVar70._16_4_ = (int)(pfVar20[lVar9 + 4] * scale + auVar29._16_4_);
            auVar70._20_4_ = (int)(pfVar20[lVar9 + 5] * scale + auVar29._20_4_);
            auVar70._24_4_ = (int)(pfVar20[lVar9 + 6] * scale + auVar29._24_4_);
            auVar70._28_4_ = (int)(pfVar20[lVar9 + 7] + auVar29._28_4_);
            auVar25 = vpmovsdb_avx512vl(auVar70);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = auVar25._0_8_;
            auVar25 = vpmaxsb_avx(auVar27,auVar26);
            in_ZMM9 = ZEXT1664(auVar25);
            *(long *)*pauVar13 = auVar25._0_8_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
            pfVar20 = pfVar20 + 4;
          }
        }
        if (iVar5 == 1) {
          for (iVar17 = 0; iVar17 + 1 < max_kk; iVar17 = iVar17 + 2) {
            auVar29 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
            auVar78 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar29);
            auVar29 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar29 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar29);
            auVar73._0_4_ = auVar78._0_4_ * scale;
            auVar73._4_4_ = auVar78._4_4_ * scale;
            auVar73._8_4_ = auVar78._8_4_ * scale;
            auVar73._12_4_ = auVar78._12_4_ * scale;
            auVar73._16_4_ = auVar78._16_4_ * scale;
            auVar73._20_4_ = auVar78._20_4_ * scale;
            auVar73._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
            auVar73._24_4_ = auVar78._24_4_ * scale;
            fVar75 = auVar29._0_4_ * scale;
            fVar80 = auVar29._4_4_ * scale;
            auVar4._4_4_ = fVar80;
            auVar4._0_4_ = fVar75;
            fVar81 = auVar29._8_4_ * scale;
            auVar4._8_4_ = fVar81;
            fVar82 = auVar29._12_4_ * scale;
            auVar4._12_4_ = fVar82;
            fVar83 = auVar29._16_4_ * scale;
            auVar4._16_4_ = fVar83;
            fVar84 = auVar29._20_4_ * scale;
            auVar4._20_4_ = fVar84;
            fVar85 = auVar29._24_4_ * scale;
            auVar4._24_4_ = fVar85;
            auVar4._28_4_ = auVar78._28_4_;
            auVar29 = vpternlogd_avx512vl(auVar40,auVar73._0_32_,auVar38,0xf8);
            auVar30 = vpternlogd_avx512vl(auVar40,auVar4,auVar38,0xf8);
            auVar71._0_4_ = (int)(auVar73._0_4_ + auVar29._0_4_);
            auVar71._4_4_ = (int)(auVar73._4_4_ + auVar29._4_4_);
            auVar71._8_4_ = (int)(auVar73._8_4_ + auVar29._8_4_);
            auVar71._12_4_ = (int)(auVar73._12_4_ + auVar29._12_4_);
            auVar71._16_4_ = (int)(auVar73._16_4_ + auVar29._16_4_);
            auVar71._20_4_ = (int)(auVar73._20_4_ + auVar29._20_4_);
            auVar71._24_4_ = (int)(auVar73._24_4_ + auVar29._24_4_);
            auVar71._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar29._28_4_);
            auVar79._0_4_ = (int)(fVar75 + auVar30._0_4_);
            auVar79._4_4_ = (int)(fVar80 + auVar30._4_4_);
            auVar79._8_4_ = (int)(fVar81 + auVar30._8_4_);
            auVar79._12_4_ = (int)(fVar82 + auVar30._12_4_);
            auVar79._16_4_ = (int)(fVar83 + auVar30._16_4_);
            auVar79._20_4_ = (int)(fVar84 + auVar30._20_4_);
            auVar79._24_4_ = (int)(fVar85 + auVar30._24_4_);
            auVar79._28_4_ = (int)(auVar78._28_4_ + auVar30._28_4_);
            auVar29 = vpackssdw_avx2(auVar71,auVar79);
            auVar29 = vpermq_avx2(auVar29,0xd8);
            auVar29 = vpminsw_avx2(auVar29,auVar43);
            auVar29 = vpmaxsw_avx2(auVar29,auVar55);
            in_ZMM10 = ZEXT1664(auVar29._16_16_);
            auVar25 = vpacksswb_avx(auVar29._0_16_,auVar29._16_16_);
            auVar25 = vpshufb_avx(auVar25,auVar23);
            in_ZMM9 = ZEXT1664(auVar25);
            *pauVar13 = auVar25;
            pauVar13 = pauVar13 + 1;
          }
          for (; iVar17 < max_kk; iVar17 = iVar17 + 1) {
            auVar29 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
            auVar29 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar29);
            auVar74._0_4_ = auVar29._0_4_ * scale;
            auVar74._4_4_ = auVar29._4_4_ * scale;
            auVar74._8_4_ = auVar29._8_4_ * scale;
            auVar74._12_4_ = auVar29._12_4_ * scale;
            auVar74._16_4_ = auVar29._16_4_ * scale;
            auVar74._20_4_ = auVar29._20_4_ * scale;
            auVar74._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
            auVar74._24_4_ = auVar29._24_4_ * scale;
            auVar29 = vpternlogd_avx512vl(auVar40,auVar74._0_32_,auVar38,0xf8);
            in_ZMM10 = ZEXT3264(auVar29);
            auVar72._0_4_ = (int)(auVar74._0_4_ + auVar29._0_4_);
            auVar72._4_4_ = (int)(auVar74._4_4_ + auVar29._4_4_);
            auVar72._8_4_ = (int)(auVar74._8_4_ + auVar29._8_4_);
            auVar72._12_4_ = (int)(auVar74._12_4_ + auVar29._12_4_);
            auVar72._16_4_ = (int)(auVar74._16_4_ + auVar29._16_4_);
            auVar72._20_4_ = (int)(auVar74._20_4_ + auVar29._20_4_);
            auVar72._24_4_ = (int)(auVar74._24_4_ + auVar29._24_4_);
            auVar72._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar29._28_4_);
            auVar25 = vpmovsdb_avx512vl(auVar72);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = auVar25._0_8_;
            auVar25 = vpmaxsb_avx(auVar68,auVar26);
            in_ZMM9 = ZEXT1664(auVar25);
            *(long *)*pauVar13 = auVar25._0_8_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
          }
        }
        lVar11 = lVar11 + lVar6 * 0x20;
        lVar15 = lVar15 + lVar6 * 0x20;
      }
      auVar25 = vpbroadcastd_avx512vl();
      vpmulld_avx(auVar25,_DAT_00539290);
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar24._8_4_ = 0x3f000000;
      auVar24._0_8_ = 0x3f0000003f000000;
      auVar24._12_4_ = 0x3f000000;
      auVar37._8_2_ = 0x7f;
      auVar37._0_8_ = 0x7f007f007f007f;
      auVar37._10_2_ = 0x7f;
      auVar37._12_2_ = 0x7f;
      auVar37._14_2_ = 0x7f;
      auVar39._8_2_ = 0xff81;
      auVar39._0_8_ = 0xff81ff81ff81ff81;
      auVar39._10_2_ = 0xff81;
      auVar39._12_2_ = 0xff81;
      auVar39._14_2_ = 0xff81;
      for (; (long)(uVar12 | 3) < lVar10; uVar12 = uVar12 + 4) {
        pfVar20 = (float *)((long)pvVar2 + (uVar12 + lVar14) * lVar6 * 4 + lVar8 * 4);
        if (iVar5 == 4) {
          for (iVar17 = 0; iVar17 + 1 < max_kk; iVar17 = iVar17 + 2) {
            auVar44._0_4_ = scale * *pfVar20;
            auVar44._4_4_ = scale * pfVar20[1];
            auVar44._8_4_ = scale * pfVar20[2];
            auVar44._12_4_ = scale * pfVar20[3];
            auVar56._0_4_ = scale * pfVar20[4];
            auVar56._4_4_ = scale * pfVar20[5];
            auVar56._8_4_ = scale * pfVar20[6];
            auVar56._12_4_ = scale * pfVar20[7];
            auVar23 = vunpcklps_avx(auVar44,auVar56);
            auVar28 = vunpckhps_avx(auVar44,auVar56);
            auVar26 = vpternlogd_avx512vl(auVar24,auVar23,auVar25,0xf8);
            auVar27 = vpternlogd_avx512vl(auVar24,auVar28,auVar25,0xf8);
            auVar57._0_4_ = (int)(auVar23._0_4_ + auVar26._0_4_);
            auVar57._4_4_ = (int)(auVar23._4_4_ + auVar26._4_4_);
            auVar57._8_4_ = (int)(auVar23._8_4_ + auVar26._8_4_);
            auVar57._12_4_ = (int)(auVar23._12_4_ + auVar26._12_4_);
            auVar45._0_4_ = (int)(auVar27._0_4_ + auVar28._0_4_);
            auVar45._4_4_ = (int)(auVar27._4_4_ + auVar28._4_4_);
            auVar45._8_4_ = (int)(auVar27._8_4_ + auVar28._8_4_);
            auVar45._12_4_ = (int)(auVar27._12_4_ + auVar28._12_4_);
            auVar28 = vpackssdw_avx(auVar57,auVar45);
            auVar28 = vpminsw_avx(auVar28,auVar37);
            auVar28 = vpmaxsw_avx(auVar28,auVar39);
            auVar28 = vpacksswb_avx(auVar28,auVar28);
            auVar31 = ZEXT1664(auVar28);
            *(long *)*pauVar13 = auVar28._0_8_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
            pfVar20 = pfVar20 + 8;
          }
          for (; iVar17 < max_kk; iVar17 = iVar17 + 1) {
            auVar46._0_4_ = scale * *pfVar20;
            auVar46._4_4_ = scale * pfVar20[1];
            auVar46._8_4_ = scale * pfVar20[2];
            auVar46._12_4_ = scale * pfVar20[3];
            auVar28 = vpternlogd_avx512vl(auVar24,auVar46,auVar25,0xf8);
            auVar47._0_4_ = (int)(auVar46._0_4_ + auVar28._0_4_);
            auVar47._4_4_ = (int)(auVar46._4_4_ + auVar28._4_4_);
            auVar47._8_4_ = (int)(auVar46._8_4_ + auVar28._8_4_);
            auVar47._12_4_ = (int)(auVar46._12_4_ + auVar28._12_4_);
            auVar28 = vpackssdw_avx(auVar47,auVar47);
            auVar28 = vpminsw_avx(auVar28,auVar37);
            auVar28 = vpmaxsw_avx(auVar28,auVar39);
            auVar28 = vpacksswb_avx(auVar28,auVar28);
            auVar31 = ZEXT1664(auVar28);
            *(int *)*pauVar13 = auVar28._0_4_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
            pfVar20 = pfVar20 + 4;
          }
        }
        if (iVar5 == 1) {
          for (iVar17 = 0; iVar17 + 1 < max_kk; iVar17 = iVar17 + 2) {
            auVar28 = vpcmpeqd_avx(auVar31._0_16_,auVar31._0_16_);
            auVar26 = vgatherdps(ZEXT816(0) << 0x40,auVar28);
            auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar28 = vgatherdps(ZEXT816(0) << 0x40,auVar28);
            auVar23 = vunpcklps_avx(auVar26,auVar28);
            auVar28 = vunpckhps_avx(auVar26,auVar28);
            auVar48._0_4_ = auVar23._0_4_ * scale;
            auVar48._4_4_ = auVar23._4_4_ * scale;
            auVar48._8_4_ = auVar23._8_4_ * scale;
            auVar48._12_4_ = auVar23._12_4_ * scale;
            auVar58._0_4_ = auVar28._0_4_ * scale;
            auVar58._4_4_ = auVar28._4_4_ * scale;
            auVar58._8_4_ = auVar28._8_4_ * scale;
            auVar58._12_4_ = auVar28._12_4_ * scale;
            auVar28 = vpternlogd_avx512vl(auVar24,auVar48,auVar25,0xf8);
            auVar23 = vpternlogd_avx512vl(auVar24,auVar58,auVar25,0xf8);
            auVar49._0_4_ = (int)(auVar28._0_4_ + auVar48._0_4_);
            auVar49._4_4_ = (int)(auVar28._4_4_ + auVar48._4_4_);
            auVar49._8_4_ = (int)(auVar28._8_4_ + auVar48._8_4_);
            auVar49._12_4_ = (int)(auVar28._12_4_ + auVar48._12_4_);
            auVar59._0_4_ = (int)(auVar23._0_4_ + auVar58._0_4_);
            auVar59._4_4_ = (int)(auVar23._4_4_ + auVar58._4_4_);
            auVar59._8_4_ = (int)(auVar23._8_4_ + auVar58._8_4_);
            auVar59._12_4_ = (int)(auVar23._12_4_ + auVar58._12_4_);
            auVar28 = vpackssdw_avx(auVar49,auVar59);
            auVar28 = vpminsw_avx(auVar28,auVar37);
            auVar28 = vpmaxsw_avx(auVar28,auVar39);
            auVar28 = vpacksswb_avx(auVar28,auVar28);
            auVar31 = ZEXT1664(auVar28);
            *(long *)*pauVar13 = auVar28._0_8_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
          }
          for (; iVar17 < max_kk; iVar17 = iVar17 + 1) {
            auVar28 = vpcmpeqd_avx(auVar31._0_16_,auVar31._0_16_);
            auVar28 = vgatherdps(ZEXT816(0) << 0x40,auVar28);
            auVar50._0_4_ = auVar28._0_4_ * scale;
            auVar50._4_4_ = auVar28._4_4_ * scale;
            auVar50._8_4_ = auVar28._8_4_ * scale;
            auVar50._12_4_ = auVar28._12_4_ * scale;
            auVar28 = vpternlogd_avx512vl(auVar24,auVar50,auVar25,0xf8);
            auVar51._0_4_ = (int)(auVar50._0_4_ + auVar28._0_4_);
            auVar51._4_4_ = (int)(auVar50._4_4_ + auVar28._4_4_);
            auVar51._8_4_ = (int)(auVar50._8_4_ + auVar28._8_4_);
            auVar51._12_4_ = (int)(auVar50._12_4_ + auVar28._12_4_);
            auVar28 = vpackssdw_avx(auVar51,auVar51);
            auVar28 = vpminsw_avx(auVar28,auVar37);
            auVar28 = vpmaxsw_avx(auVar28,auVar39);
            auVar28 = vpacksswb_avx(auVar28,auVar28);
            auVar31 = ZEXT1664(auVar28);
            *(int *)*pauVar13 = auVar28._0_4_;
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
          }
        }
        lVar11 = lVar11 + lVar6 * 0x10;
        lVar15 = lVar15 + lVar6 * 0x10;
      }
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar52._8_4_ = 0x3effffff;
      auVar52._0_8_ = 0x3effffff3effffff;
      auVar52._12_4_ = 0x3effffff;
      for (; (long)(uVar12 | 1) < lVar10; uVar12 = uVar12 + 2) {
        pvVar2 = B->data;
        pfVar20 = (float *)((long)pvVar2 + lVar19 * 4 + (uVar12 + lVar14) * lVar6 * 4);
        pauVar22 = pauVar13;
        for (lVar8 = 0; (int)lVar8 + 3 < max_kk; lVar8 = lVar8 + 4) {
          auVar60._0_4_ = scale * *pfVar20;
          auVar60._4_4_ = scale * pfVar20[1];
          auVar60._8_4_ = scale * pfVar20[2];
          auVar60._12_4_ = scale * pfVar20[3];
          pfVar1 = (float *)((long)pvVar2 + lVar8 * 4 + lVar15);
          auVar65._0_4_ = scale * *pfVar1;
          auVar65._4_4_ = scale * pfVar1[1];
          auVar65._8_4_ = scale * pfVar1[2];
          auVar65._12_4_ = scale * pfVar1[3];
          auVar28 = vmovlhps_avx(auVar60,auVar65);
          auVar23 = vunpckhpd_avx(auVar60,auVar65);
          auVar26 = vpternlogd_avx512vl(auVar24,auVar28,auVar25,0xf8);
          auVar27 = vpternlogd_avx512vl(auVar24,auVar23,auVar25,0xf8);
          auVar66._0_4_ = (int)(auVar28._0_4_ + auVar26._0_4_);
          auVar66._4_4_ = (int)(auVar28._4_4_ + auVar26._4_4_);
          auVar66._8_4_ = (int)(auVar28._8_4_ + auVar26._8_4_);
          auVar66._12_4_ = (int)(auVar28._12_4_ + auVar26._12_4_);
          auVar61._0_4_ = (int)(auVar27._0_4_ + auVar23._0_4_);
          auVar61._4_4_ = (int)(auVar27._4_4_ + auVar23._4_4_);
          auVar61._8_4_ = (int)(auVar27._8_4_ + auVar23._8_4_);
          auVar61._12_4_ = (int)(auVar27._12_4_ + auVar23._12_4_);
          auVar28 = vpackssdw_avx(auVar66,auVar61);
          auVar28 = vpminsw_avx(auVar28,auVar37);
          auVar28 = vpmaxsw_avx(auVar28,auVar39);
          auVar28 = vpacksswb_avx(auVar28,auVar28);
          *(long *)*pauVar22 = auVar28._0_8_;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
          pfVar20 = pfVar20 + 4;
        }
        for (; (int)lVar8 + 1 < max_kk; lVar8 = lVar8 + 2) {
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)((long)pvVar2 + lVar8 * 4 + lVar15);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)((long)pvVar2 + lVar8 * 4 + lVar11);
          auVar28 = vmovlhps_avx(auVar67,auVar62);
          auVar63._0_4_ = scale * auVar28._0_4_;
          auVar63._4_4_ = scale * auVar28._4_4_;
          auVar63._8_4_ = scale * auVar28._8_4_;
          auVar63._12_4_ = scale * auVar28._12_4_;
          auVar28 = vpternlogd_avx512vl(auVar24,auVar63,auVar25,0xf8);
          auVar64._0_4_ = (int)(auVar28._0_4_ + auVar63._0_4_);
          auVar64._4_4_ = (int)(auVar28._4_4_ + auVar63._4_4_);
          auVar64._8_4_ = (int)(auVar28._8_4_ + auVar63._8_4_);
          auVar64._12_4_ = (int)(auVar28._12_4_ + auVar63._12_4_);
          auVar28 = vpackssdw_avx(auVar64,auVar64);
          auVar28 = vpminsw_avx(auVar28,auVar37);
          auVar28 = vpmaxsw_avx(auVar28,auVar39);
          auVar28 = vpacksswb_avx(auVar28,auVar28);
          *(int *)(*pauVar13 + lVar8 * 2) = auVar28._0_4_;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + 4);
        }
        for (; pauVar13 = pauVar22, (int)lVar8 < max_kk; lVar8 = lVar8 + 1) {
          fVar75 = scale * *(float *)((long)pvVar2 + lVar8 * 4 + lVar11);
          auVar28 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)fVar75),auVar41,0xf8);
          auVar28 = ZEXT416((uint)(auVar28._0_4_ + fVar75));
          auVar28 = vroundss_avx(auVar28,auVar28,0xb);
          iVar5 = (int)auVar28._0_4_;
          if ((int)auVar28._0_4_ < -0x7e) {
            iVar5 = -0x7f;
          }
          if (0x7e < iVar5) {
            iVar5 = 0x7f;
          }
          (*pauVar13)[0] = (char)iVar5;
          fVar75 = scale * *(float *)((long)pvVar2 + lVar8 * 4 + lVar15);
          auVar28 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)fVar75),auVar41,0xf8);
          auVar28 = ZEXT416((uint)(auVar28._0_4_ + fVar75));
          auVar28 = vroundss_avx(auVar28,auVar28,0xb);
          iVar5 = (int)auVar28._0_4_;
          if ((int)auVar28._0_4_ < -0x7e) {
            iVar5 = -0x7f;
          }
          if (0x7e < iVar5) {
            iVar5 = 0x7f;
          }
          (*pauVar13)[1] = (char)iVar5;
          pauVar22 = (undefined1 (*) [16])(*pauVar13 + 2);
        }
        lVar11 = lVar11 + lVar6 * 8;
        lVar15 = lVar15 + lVar6 * 8;
      }
      auVar42._8_4_ = 0x3effffff;
      auVar42._0_8_ = 0x3effffff3effffff;
      auVar42._12_4_ = 0x3effffff;
      for (; (long)uVar12 < lVar10; uVar12 = uVar12 + 1) {
        pvVar2 = B->data;
        pfVar20 = (float *)((long)pvVar2 + lVar19 * 4 + (uVar12 + lVar14) * lVar6 * 4);
        for (lVar15 = 0; (int)lVar15 + 3 < max_kk; lVar15 = lVar15 + 4) {
          auVar53._0_4_ = scale * *pfVar20;
          auVar53._4_4_ = scale * pfVar20[1];
          auVar53._8_4_ = scale * pfVar20[2];
          auVar53._12_4_ = scale * pfVar20[3];
          auVar28 = vpternlogd_avx512vl(auVar24,auVar53,auVar25,0xf8);
          auVar54._0_4_ = (int)(auVar53._0_4_ + auVar28._0_4_);
          auVar54._4_4_ = (int)(auVar53._4_4_ + auVar28._4_4_);
          auVar54._8_4_ = (int)(auVar53._8_4_ + auVar28._8_4_);
          auVar54._12_4_ = (int)(auVar53._12_4_ + auVar28._12_4_);
          auVar28 = vpackssdw_avx(auVar54,auVar54);
          auVar28 = vpminsw_avx(auVar28,auVar37);
          auVar28 = vpmaxsw_avx(auVar28,auVar39);
          auVar28 = vpacksswb_avx(auVar28,auVar28);
          *(int *)(*pauVar13 + lVar15) = auVar28._0_4_;
          pfVar20 = pfVar20 + 4;
        }
        for (; (int)lVar15 < max_kk; lVar15 = lVar15 + 1) {
          fVar75 = scale * *(float *)((long)pvVar2 + lVar15 * 4 + lVar11);
          auVar28 = vpternlogd_avx512vl(auVar42,ZEXT416((uint)fVar75),auVar25,0xf8);
          auVar28 = ZEXT416((uint)(fVar75 + auVar28._0_4_));
          auVar28 = vroundss_avx(auVar28,auVar28,0xb);
          iVar5 = (int)auVar28._0_4_;
          if (iVar5 < -0x7e) {
            iVar5 = -0x7f;
          }
          if (0x7e < iVar5) {
            iVar5 = 0x7f;
          }
          (*pauVar13)[lVar15] = (char)iVar5;
        }
        lVar11 = lVar11 + lVar6 * 4;
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar15);
      }
      return;
    }
    pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

static void pack_B_tile_quantize(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}